

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::pipeline::anon_unknown_0::createImage2DAndBindMemory
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,Context *context,
          VkFormat format,deUint32 width,deUint32 height,VkImageUsageFlags usage,
          VkSampleCountFlagBits sampleCount,
          MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc)

{
  deUint64 dVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkResult result;
  DeviceInterface *vk_00;
  VkDevice device;
  MovePtr *this;
  Handle<(vk::HandleType)9> *pHVar2;
  Allocation *pAVar3;
  VkDeviceMemory VVar4;
  VkDeviceSize VVar5;
  Allocation *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  VkMemoryRequirements local_e8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_c0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_b0;
  undefined1 local_99;
  undefined1 local_98 [8];
  VkImageCreateInfo colorImageParams;
  deUint32 queueFamilyIndex;
  VkDevice vkDevice;
  DeviceInterface *vk;
  VkImageUsageFlags usage_local;
  deUint32 height_local;
  deUint32 width_local;
  VkFormat format_local;
  Context *context_local;
  Move<vk::Handle<(vk::HandleType)9>_> *image;
  
  vk_00 = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  colorImageParams._84_4_ = Context::getUniversalQueueFamilyIndex(context);
  local_98._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  colorImageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorImageParams._4_4_ = 0;
  colorImageParams.pNext._0_4_ = 0;
  colorImageParams.pNext._4_4_ = 1;
  colorImageParams.extent.width = 1;
  colorImageParams.extent.height = 1;
  colorImageParams.extent.depth = 1;
  colorImageParams.mipLevels = sampleCount;
  colorImageParams.arrayLayers = 0;
  colorImageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  colorImageParams.usage = 1;
  colorImageParams._64_8_ = &colorImageParams.field_0x54;
  colorImageParams.pQueueFamilyIndices._0_4_ = 0;
  local_99 = 0;
  colorImageParams.flags = format;
  colorImageParams.imageType = width;
  colorImageParams.format = height;
  colorImageParams.samples = usage;
  ::vk::createImage(__return_storage_ptr__,vk_00,device,(VkImageCreateInfo *)local_98,
                    (VkAllocationCallbacks *)0x0);
  this = (MovePtr *)Context::getDefaultAllocator(context);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  ::vk::getImageMemoryRequirements(&local_e8,vk_00,device,(VkImage)pHVar2->m_internal);
  (*(*(_func_int ***)this)[3])(&local_c0,this,&local_e8,(ulong)::vk::MemoryRequirement::Any);
  local_b0 = de::details::MovePtr::operator_cast_to_PtrData(&local_c0,this);
  data._8_8_ = in_stack_fffffffffffffec0;
  data.ptr = in_stack_fffffffffffffeb8;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=(pAlloc,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_c0);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  dVar1 = pHVar2->m_internal;
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&pAlloc->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                     );
  VVar4 = ::vk::Allocation::getMemory(pAVar3);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&pAlloc->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                     );
  VVar5 = ::vk::Allocation::getOffset(pAVar3);
  result = (*vk_00->_vptr_DeviceInterface[0xd])(vk_00,device,dVar1,VVar4.m_internal,VVar5);
  ::vk::checkResult(result,
                    "vk.bindImageMemory(vkDevice, *image, (*pAlloc)->getMemory(), (*pAlloc)->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x1f1);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImage> createImage2DAndBindMemory (Context&                          context,
										  VkFormat                          format,
										  deUint32                          width,
										  deUint32                          height,
										  VkImageUsageFlags                 usage,
										  VkSampleCountFlagBits             sampleCount,
										  de::details::MovePtr<Allocation>* pAlloc)
{
	const DeviceInterface&  vk               = context.getDeviceInterface();
	const VkDevice          vkDevice         = context.getDevice();
	const deUint32          queueFamilyIndex = context.getUniversalQueueFamilyIndex();

	const VkImageCreateInfo colorImageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,                                        // VkStructureType      sType;
		DE_NULL,                                                                    // const void*          pNext;
		0u,                                                                         // VkImageCreateFlags   flags;
		VK_IMAGE_TYPE_2D,                                                           // VkImageType          imageType;
		format,                                                                     // VkFormat             format;
		{ width, height, 1u },                                                      // VkExtent3D           extent;
		1u,                                                                         // deUint32             mipLevels;
		1u,                                                                         // deUint32             arraySize;
		sampleCount,                                                                // deUint32             samples;
		VK_IMAGE_TILING_OPTIMAL,                                                    // VkImageTiling        tiling;
		usage,                                                                      // VkImageUsageFlags    usage;
		VK_SHARING_MODE_EXCLUSIVE,                                                  // VkSharingMode        sharingMode;
		1u,                                                                         // deUint32             queueFamilyCount;
		&queueFamilyIndex,                                                          // const deUint32*      pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,                                                  // VkImageLayout        initialLayout;
	};

	Move<VkImage> image = createImage(vk, vkDevice, &colorImageParams);

	*pAlloc = context.getDefaultAllocator().allocate(getImageMemoryRequirements(vk, vkDevice, *image), MemoryRequirement::Any);
	VK_CHECK(vk.bindImageMemory(vkDevice, *image, (*pAlloc)->getMemory(), (*pAlloc)->getOffset()));

	return image;
}